

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O3

RelationStats *
duckdb::RelationStatisticsHelper::CombineStatsOfReorderableOperator
          (RelationStats *__return_storage_ptr__,vector<duckdb::ColumnBinding,_true> *bindings,
          vector<duckdb::RelationStats,_true> *relation_stats)

{
  pointer *ppDVar1;
  pointer pRVar2;
  iterator __position;
  pointer pbVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  undefined3 uVar7;
  pointer pDVar8;
  ulong uVar9;
  long lVar10;
  pointer pRVar11;
  ulong uVar12;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  DistinctCount *__args;
  
  uVar12 = 0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_distinct_count).
  super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
  super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->cardinality = 1;
  __return_storage_ptr__->filter_strength = 1.0;
  __return_storage_ptr__->stats_initialized = false;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  pRVar11 = (relation_stats->
            super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>).
            super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (relation_stats->
           super_vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>).
           super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pRVar11 != pRVar2) {
    uVar12 = 0;
    do {
      pDVar8 = (pRVar11->column_distinct_count).
               super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pRVar11->column_distinct_count).
          super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
          super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>._M_impl.
          super__Vector_impl_data._M_finish != pDVar8) {
        lVar13 = 0;
        lVar10 = 0;
        uVar9 = 0;
        do {
          __args = (DistinctCount *)((long)&pDVar8->distinct_count + lVar10);
          __position._M_current =
               (__return_storage_ptr__->column_distinct_count).
               super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->column_distinct_count).
              super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>>::
            _M_realloc_insert<duckdb::DistinctCount_const&>
                      ((vector<duckdb::DistinctCount,std::allocator<duckdb::DistinctCount>> *)
                       __return_storage_ptr__,__position,__args);
          }
          else {
            uVar4 = *(undefined4 *)((long)&__args->distinct_count + 4);
            bVar6 = __args->from_hll;
            uVar7 = *(undefined3 *)&__args->field_0x9;
            uVar5 = *(undefined4 *)&__args->field_0xc;
            *(int *)&(__position._M_current)->distinct_count = (int)__args->distinct_count;
            *(undefined4 *)((long)&(__position._M_current)->distinct_count + 4) = uVar4;
            (__position._M_current)->from_hll = bVar6;
            *(undefined3 *)&(__position._M_current)->field_0x9 = uVar7;
            *(undefined4 *)&(__position._M_current)->field_0xc = uVar5;
            ppDVar1 = &(__return_storage_ptr__->column_distinct_count).
                       super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                       super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppDVar1 = *ppDVar1 + 1;
          }
          pbVar3 = (pRVar11->column_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pRVar11->column_names).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar9
             ) {
            ::std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__return_storage_ptr__->column_names,
                      (value_type *)((long)&(pbVar3->_M_dataplus)._M_p + lVar13));
          uVar9 = uVar9 + 1;
          pDVar8 = (pRVar11->column_distinct_count).
                   super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                   super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x10;
          lVar13 = lVar13 + 0x20;
        } while (uVar9 < (ulong)((long)(pRVar11->column_distinct_count).
                                       super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                       .
                                       super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar8 >>
                                4));
      }
      ::std::operator+(&local_50,"joined with ",&pRVar11->table_name);
      ::std::__cxx11::string::_M_append
                ((char *)&__return_storage_ptr__->table_name,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (uVar12 <= pRVar11->cardinality) {
        uVar12 = pRVar11->cardinality;
      }
      pRVar11 = pRVar11 + 1;
    } while (pRVar11 != pRVar2);
  }
  __return_storage_ptr__->stats_initialized = true;
  __return_storage_ptr__->cardinality = uVar12;
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::CombineStatsOfReorderableOperator(vector<ColumnBinding> &bindings,
                                                                          vector<RelationStats> relation_stats) {
	RelationStats stats;
	idx_t max_card = 0;
	for (auto &child_stats : relation_stats) {
		for (idx_t i = 0; i < child_stats.column_distinct_count.size(); i++) {
			stats.column_distinct_count.push_back(child_stats.column_distinct_count.at(i));
			stats.column_names.push_back(child_stats.column_names.at(i));
		}
		stats.table_name += "joined with " + child_stats.table_name;
		max_card = MaxValue(max_card, child_stats.cardinality);
	}
	stats.stats_initialized = true;
	stats.cardinality = max_card;
	return stats;
}